

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__reload_cache(ma_dr_flac_bs *bs)

{
  ma_dr_flac_cache_t mVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  ushort uVar10;
  ulong uVar11;
  long lVar12;
  ma_dr_flac_cache_t *pmVar13;
  
  uVar10 = bs->crc16;
  uVar7 = (uint)uVar10;
  if (bs->crc16CacheIgnoredBytes < 8) {
    mVar1 = bs->crc16Cache;
    uVar6 = (uint)mVar1;
    uVar2 = (ushort)(mVar1 >> 0x30);
    uVar4 = (uint)(mVar1 >> 0x10);
    uVar3 = (uint)(mVar1 >> 0x18);
    uVar5 = (uint)(mVar1 >> 0x20);
    switch(bs->crc16CacheIgnoredBytes) {
    case 0:
      bs->crc16 = ma_dr_flac__crc16_table
                  [((uint)ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [(uVar5 >> 8 ^
                                   ((uint)ma_dr_flac__crc16_table
                                          [(uint)(uVar10 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [((uint)uVar2 ^
                                          ((uint)uVar10 << 8 ^
                                          (uint)ma_dr_flac__crc16_table
                                                [(uint)(uVar10 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)])
                                          >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar10 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar10 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [(uVar5 >> 8 ^
                                                  ((uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar10 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar2 ^
                                                         ((uint)uVar10 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar10 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                           0xff) & 0xff]) >> 8 & 0xff ^ uVar3 & 0xff] << 8 ^ uVar6 ^
                   (uint)ma_dr_flac__crc16_table
                         [(((uint)ma_dr_flac__crc16_table
                                  [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar10 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar10 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff] << 8 ^
                                            (uint)ma_dr_flac__crc16_table
                                                  [(uVar5 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar10 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar2 ^
                                                          ((uint)uVar10 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                            8 & 0xff) & 0xff] << 8 ^
                           (uint)ma_dr_flac__crc16_table
                                 [((uint)ma_dr_flac__crc16_table
                                         [(uVar5 >> 8 ^
                                          ((uint)ma_dr_flac__crc16_table
                                                 [(uint)(uVar10 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)]
                                           << 8 ^ (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar2 ^
                                                         ((uint)uVar10 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar10 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar2 ^
                                                          ((uint)uVar10 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar10 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar10 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                  uVar3 & 0xff]) >> 8 & 0xff ^ uVar4 & 0xffff) & 0xff]) >> 8 & 0xff]
                  << 8 ^ ma_dr_flac__crc16_table
                         [(((uint)ma_dr_flac__crc16_table
                                  [(((uint)ma_dr_flac__crc16_table
                                           [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar10 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar10 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar5 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar10 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar10 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar10 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                    (uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar5 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar10 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar2 ^
                                                          ((uint)uVar10 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar10 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar10 >> 8) ^
                                                                            (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar10 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar10 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           uVar3 & 0xff]) >> 8 & 0xff ^ uVar4 & 0xffff) & 0xff] << 8
                           ^ (uint)ma_dr_flac__crc16_table
                                   [((uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar5 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar10 >> 8) ^
                                                            (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar10 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar10 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar10 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar10 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar10 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar10 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar3 & 0xff] << 8 ^ uVar6 ^
                                    (uint)ma_dr_flac__crc16_table
                                          [(((uint)ma_dr_flac__crc16_table
                                                   [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar10 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar10 >> 8) ^
                                                                            (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar10 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar10 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                            (uint)ma_dr_flac__crc16_table
                                                  [((uint)ma_dr_flac__crc16_table
                                                          [(uVar5 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar10 >> 8) ^
                                                                   (uint)(byte)(mVar1 >> 0x38)] << 8
                                                           ^ (uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar10 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar10 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                                  << 8 ^ (uint)ma_dr_flac__crc16_table
                                                               [(uVar5 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar10 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar10 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar10 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar10 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar3 & 0xff]) >> 8 & 0xff ^ uVar4 & 0xffff) &
                                           0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar6) & 0xff];
      break;
    case 1:
      uVar7 = (uint)(ushort)(uVar10 << 8 ^
                            ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar10 >> 8) & 0xff]);
    case 2:
      uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                            ma_dr_flac__crc16_table[(uVar5 ^ uVar7) >> 8 & 0xff]);
    case 3:
      uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                            ma_dr_flac__crc16_table[(uVar5 ^ uVar7 >> 8) & 0xff]);
    case 4:
      uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                            ma_dr_flac__crc16_table[uVar7 >> 8 ^ uVar3 & 0xff]);
    case 5:
      uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                            ma_dr_flac__crc16_table[(uVar7 >> 8 ^ uVar4 & 0xffff) & 0xff]);
    case 6:
      uVar10 = (ushort)(uVar7 << 8) ^ ma_dr_flac__crc16_table[(uVar6 ^ uVar7) >> 8 & 0xff];
    case 7:
      uVar10 = uVar10 << 8 ^ ma_dr_flac__crc16_table[(uVar6 ^ uVar10 >> 8) & 0xff];
      goto LAB_00167d37;
    }
  }
  else {
LAB_00167d37:
    bs->crc16 = uVar10;
    bs->crc16CacheIgnoredBytes = 0;
  }
  uVar7 = bs->nextL2Line;
  if ((ulong)uVar7 < 0x200) {
    bs->nextL2Line = uVar7 + 1;
    pmVar13 = bs->cacheL2 + uVar7;
  }
  else {
    uVar8 = bs->unalignedByteCount;
    if (uVar8 != 0) {
LAB_00167d87:
      uVar7 = (int)uVar8 * -8 + 0x40;
      bs->consumedBits = uVar7;
      uVar11 = bs->unalignedCache;
      uVar11 = ~(0xffffffffffffffffU >> ((char)uVar8 * '\b' & 0x3fU)) &
               (uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28
               | uVar11 << 0x38);
      bs->cache = uVar11;
      bs->unalignedByteCount = 0;
      bs->crc16Cache = uVar11 >> ((char)uVar8 * -8 & 0x3fU);
      bs->crc16CacheIgnoredBytes = uVar7 >> 3;
      return 1;
    }
    pmVar13 = bs->cacheL2;
    sVar9 = (*bs->onRead)(bs->pUserData,pmVar13,0x1000);
    if (sVar9 == 0x1000) {
      bs->nextL2Line = 1;
    }
    else {
      uVar11 = sVar9 >> 3;
      uVar8 = sVar9 & 7;
      bs->unalignedByteCount = uVar8;
      if (uVar8 == 0) {
        if (sVar9 < 8) {
          bs->nextL2Line = 0x200;
          bs->consumedBits = 0x40;
          return 0;
        }
      }
      else {
        bs->unalignedCache = bs->cacheL2[uVar11];
        if (sVar9 < 8) {
          bs->nextL2Line = 0x200;
          goto LAB_00167d87;
        }
      }
      lVar12 = 0;
      do {
        bs->cacheL2[lVar12 + 0x1ff] = bs->cacheL2[uVar11 + lVar12 + -1];
        lVar12 = lVar12 + -1;
      } while (-lVar12 != uVar11);
      bs->nextL2Line = (int)(0x200 - uVar11) + 1;
      pmVar13 = pmVar13 + (0x200 - uVar11 & 0xffffffff);
    }
  }
  uVar8 = *pmVar13;
  uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
          (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  bs->cache = uVar8;
  bs->consumedBits = 0;
  bs->crc16Cache = uVar8;
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__reload_cache(ma_dr_flac_bs* bs)
{
    size_t bytesRead;
#ifndef MA_DR_FLAC_NO_CRC
    ma_dr_flac__update_crc16(bs);
#endif
    if (ma_dr_flac__reload_l1_cache_from_l2(bs)) {
        bs->cache = ma_dr_flac__be2host__cache_line(bs->cache);
        bs->consumedBits = 0;
#ifndef MA_DR_FLAC_NO_CRC
        bs->crc16Cache = bs->cache;
#endif
        return MA_TRUE;
    }
    bytesRead = bs->unalignedByteCount;
    if (bytesRead == 0) {
        bs->consumedBits = MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs);
        return MA_FALSE;
    }
    MA_DR_FLAC_ASSERT(bytesRead < MA_DR_FLAC_CACHE_L1_SIZE_BYTES(bs));
    bs->consumedBits = (ma_uint32)(MA_DR_FLAC_CACHE_L1_SIZE_BYTES(bs) - bytesRead) * 8;
    bs->cache = ma_dr_flac__be2host__cache_line(bs->unalignedCache);
    bs->cache &= MA_DR_FLAC_CACHE_L1_SELECTION_MASK(MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs));
    bs->unalignedByteCount = 0;
#ifndef MA_DR_FLAC_NO_CRC
    bs->crc16Cache = bs->cache >> bs->consumedBits;
    bs->crc16CacheIgnoredBytes = bs->consumedBits >> 3;
#endif
    return MA_TRUE;
}